

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterInit(Fts5Index *p,Fts5StructureSegment *pSeg,Fts5SegIter *pIter)

{
  Fts5SegIter *in_RDX;
  Fts5Index *in_RSI;
  Fts5Index *in_RDI;
  uint in_stack_ffffffffffffffe4;
  uint uVar1;
  
  if (*(int *)((long)&in_RSI->pConfig + 4) != 0) {
    if (in_RDI->rc == 0) {
      memset(in_RDX,0,0x80);
      fts5SegIterSetNext(in_RDI,in_RDX);
      in_RDX->pSeg = (Fts5StructureSegment *)in_RSI;
      in_RDX->iLeafPgno = *(int *)((long)&in_RSI->pConfig + 4) + -1;
      uVar1 = in_stack_ffffffffffffffe4;
      do {
        fts5SegIterNextPage(in_RSI,in_RDX);
        in_stack_ffffffffffffffe4 = uVar1 & 0xffffff;
        if ((in_RDI->rc == 0) &&
           (in_stack_ffffffffffffffe4 = uVar1 & 0xffffff, in_RDX->pLeaf != (Fts5Data *)0x0)) {
          in_stack_ffffffffffffffe4 = CONCAT13(in_RDX->pLeaf->nn == 4,(int3)uVar1);
        }
        uVar1 = in_stack_ffffffffffffffe4;
      } while ((char)(in_stack_ffffffffffffffe4 >> 0x18) != '\0');
    }
    if ((in_RDI->rc == 0) && (in_RDX->pLeaf != (Fts5Data *)0x0)) {
      in_RDX->iLeafOffset = 4;
      in_RDX->iPgidxOff = in_RDX->pLeaf->szLeaf + 1;
      fts5SegIterLoadTerm(in_RSI,in_RDX,in_stack_ffffffffffffffe4);
      fts5SegIterLoadNPos(in_RSI,in_RDX);
      fts5SegIterAllocTombstone(in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

static void fts5SegIterInit(
  Fts5Index *p,                   /* FTS index object */
  Fts5StructureSegment *pSeg,     /* Description of segment */
  Fts5SegIter *pIter              /* Object to populate */
){
  if( pSeg->pgnoFirst==0 ){
    /* This happens if the segment is being used as an input to an incremental
    ** merge and all data has already been "trimmed". See function
    ** fts5TrimSegments() for details. In this case leave the iterator empty.
    ** The caller will see the (pIter->pLeaf==0) and assume the iterator is
    ** at EOF already. */
    assert( pIter->pLeaf==0 );
    return;
  }

  if( p->rc==SQLITE_OK ){
    memset(pIter, 0, sizeof(*pIter));
    fts5SegIterSetNext(p, pIter);
    pIter->pSeg = pSeg;
    pIter->iLeafPgno = pSeg->pgnoFirst-1;
    do {
      fts5SegIterNextPage(p, pIter);
    }while( p->rc==SQLITE_OK && pIter->pLeaf && pIter->pLeaf->nn==4 );
  }

  if( p->rc==SQLITE_OK && pIter->pLeaf ){
    pIter->iLeafOffset = 4;
    assert( pIter->pLeaf!=0 );
    assert_nc( pIter->pLeaf->nn>4 );
    assert_nc( fts5LeafFirstTermOff(pIter->pLeaf)==4 );
    pIter->iPgidxOff = pIter->pLeaf->szLeaf+1;
    fts5SegIterLoadTerm(p, pIter, 0);
    fts5SegIterLoadNPos(p, pIter);
    fts5SegIterAllocTombstone(p, pIter);
  }
}